

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

void __thiscall
hanabi_learning_env::HanabiState::HanabiDeck::HanabiDeck(HanabiDeck *this,HanabiGame *game)

{
  int iVar1;
  long lVar2;
  int color;
  int color_00;
  allocator_type local_2d;
  value_type_conflict2 local_2c;
  
  local_2c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->card_count_,(long)game->num_ranks_ * (long)game->num_colors_,&local_2c,&local_2d
            );
  this->total_count_ = 0;
  iVar1 = game->num_ranks_;
  this->num_ranks_ = iVar1;
  for (color_00 = 0; color_00 < game->num_colors_; color_00 = color_00 + 1) {
    for (lVar2 = 0; (int)lVar2 < iVar1; lVar2 = lVar2 + 1) {
      iVar1 = HanabiGame::NumberCardInstances(game,color_00,(int)lVar2);
      (this->card_count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(long)this->num_ranks_ * (long)color_00 + lVar2] = iVar1;
      this->total_count_ = this->total_count_ + iVar1;
      iVar1 = game->num_ranks_;
    }
  }
  return;
}

Assistant:

HanabiState::HanabiDeck::HanabiDeck(const HanabiGame& game)
    : card_count_(game.NumColors() * game.NumRanks(), 0),
      total_count_(0),
      num_ranks_(game.NumRanks()) {
  for (int color = 0; color < game.NumColors(); ++color) {
    for (int rank = 0; rank < game.NumRanks(); ++rank) {
      auto count = game.NumberCardInstances(color, rank);
      card_count_[CardToIndex(color, rank)] = count;
      total_count_ += count;
    }
  }
}